

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O1

int __thiscall BamTools::FilterTool::Run(FilterTool *this,int argc,char **argv)

{
  bool bVar1;
  FilterToolPrivate *this_00;
  
  Options::Parse(argc,argv,1);
  this_00 = (FilterToolPrivate *)operator_new(0x148);
  FilterToolPrivate::FilterToolPrivate(this_00,this->m_settings);
  this->m_impl = this_00;
  bVar1 = FilterToolPrivate::Run(this_00);
  return (int)!bVar1;
}

Assistant:

int FilterTool::Run(int argc, char* argv[])
{

    // parse command line arguments
    Options::Parse(argc, argv, 1);

    // initialize FilterTool with settings
    m_impl = new FilterToolPrivate(m_settings);

    // run FilterTool, return success/fail
    if (m_impl->Run())
        return 0;
    else
        return 1;
}